

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O2

void Update_Chan_Algo5_LFO(ym2612_ *YM2612,channel_ *CH,DEV_SMPL **buf,UINT32 length)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  if (((CH->SLOT[2].Ecnt != 0x20000000) || (CH->SLOT[1].Ecnt != 0x20000000)) ||
     (CH->SLOT[3].Ecnt != 0x20000000)) {
    for (uVar6 = 0; length != uVar6; uVar6 = uVar6 + 1) {
      iVar2 = CH->SLOT[0].Fcnt;
      YM2612->in0 = iVar2;
      iVar3 = CH->SLOT[2].Fcnt;
      YM2612->in1 = iVar3;
      iVar7 = CH->SLOT[1].Fcnt;
      YM2612->in2 = iVar7;
      iVar11 = CH->SLOT[3].Fcnt;
      YM2612->in3 = iVar11;
      uVar8 = YM2612->LFO_FREQ_UP[uVar6] * CH->FMS;
      if (uVar8 < 0x200) {
        iVar2 = iVar2 + CH->SLOT[0].Finc;
        iVar3 = iVar3 + CH->SLOT[2].Finc;
        iVar7 = iVar7 + CH->SLOT[1].Finc;
        iVar10 = CH->SLOT[3].Finc;
      }
      else {
        iVar9 = (int)uVar8 >> 9;
        iVar10 = CH->SLOT[0].Finc;
        iVar1 = CH->SLOT[1].Finc;
        iVar2 = iVar2 + iVar10 + (iVar10 * iVar9 >> 9);
        iVar10 = CH->SLOT[2].Finc;
        iVar3 = iVar3 + iVar10 + (iVar10 * iVar9 >> 9);
        iVar7 = iVar7 + iVar1 + (iVar1 * iVar9 >> 9);
        iVar10 = CH->SLOT[3].Finc;
        iVar10 = (iVar9 * iVar10 >> 9) + iVar10;
      }
      CH->SLOT[0].Fcnt = iVar2;
      CH->SLOT[2].Fcnt = iVar3;
      CH->SLOT[1].Fcnt = iVar7;
      CH->SLOT[3].Fcnt = iVar10 + iVar11;
      iVar2 = YM2612->LFO_ENV_UP[uVar6];
      iVar3 = CH->SLOT[0].Ecnt;
      uVar8 = CH->SLOT[0].TLL + ENV_TAB[iVar3 >> 0x10];
      if ((CH->SLOT[0].SEG & 4) == 0) {
        iVar7 = uVar8 + (iVar2 >> ((byte)CH->SLOT[0].AMS & 0x1f));
      }
      else {
        iVar7 = 0;
        if ((int)uVar8 < 0x1000) {
          iVar7 = (iVar2 >> ((byte)CH->SLOT[0].AMS & 0x1f)) + (uVar8 ^ 0xfff);
        }
      }
      YM2612->en0 = iVar7;
      iVar7 = CH->SLOT[2].Ecnt;
      uVar8 = CH->SLOT[2].TLL + ENV_TAB[iVar7 >> 0x10];
      if ((CH->SLOT[2].SEG & 4) == 0) {
        iVar11 = uVar8 + (iVar2 >> ((byte)CH->SLOT[2].AMS & 0x1f));
      }
      else {
        iVar11 = 0;
        if ((int)uVar8 < 0x1000) {
          iVar11 = (iVar2 >> ((byte)CH->SLOT[2].AMS & 0x1f)) + (uVar8 ^ 0xfff);
        }
      }
      YM2612->en1 = iVar11;
      uVar8 = CH->SLOT[1].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[1].Ecnt + 2)];
      if ((CH->SLOT[1].SEG & 4) == 0) {
        iVar11 = uVar8 + (iVar2 >> ((byte)CH->SLOT[1].AMS & 0x1f));
      }
      else {
        iVar11 = 0;
        if ((int)uVar8 < 0x1000) {
          iVar11 = (iVar2 >> ((byte)CH->SLOT[1].AMS & 0x1f)) + (uVar8 ^ 0xfff);
        }
      }
      YM2612->en2 = iVar11;
      uVar8 = CH->SLOT[3].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[3].Ecnt + 2)];
      if ((CH->SLOT[3].SEG & 4) == 0) {
        iVar11 = uVar8 + (iVar2 >> ((byte)CH->SLOT[3].AMS & 0x1f));
      }
      else {
        iVar11 = 0;
        if ((int)uVar8 < 0x1000) {
          iVar11 = (iVar2 >> ((byte)CH->SLOT[3].AMS & 0x1f)) + (uVar8 ^ 0xfff);
        }
      }
      YM2612->en3 = iVar11;
      iVar3 = iVar3 + CH->SLOT[0].Einc;
      CH->SLOT[0].Ecnt = iVar3;
      if (CH->SLOT[0].Ecmp <= iVar3) {
        (*ENV_NEXT_EVENT[CH->SLOT[0].Ecurp])(YM2612,CH->SLOT);
        iVar7 = CH->SLOT[2].Ecnt;
      }
      iVar7 = iVar7 + CH->SLOT[2].Einc;
      CH->SLOT[2].Ecnt = iVar7;
      if (CH->SLOT[2].Ecmp <= iVar7) {
        (*ENV_NEXT_EVENT[CH->SLOT[2].Ecurp])(YM2612,CH->SLOT + 2);
      }
      iVar2 = CH->SLOT[1].Ecnt + CH->SLOT[1].Einc;
      CH->SLOT[1].Ecnt = iVar2;
      if (CH->SLOT[1].Ecmp <= iVar2) {
        (*ENV_NEXT_EVENT[CH->SLOT[1].Ecurp])(YM2612,CH->SLOT + 1);
      }
      iVar2 = CH->SLOT[3].Ecnt + CH->SLOT[3].Einc;
      CH->SLOT[3].Ecnt = iVar2;
      if (CH->SLOT[3].Ecmp <= iVar2) {
        (*ENV_NEXT_EVENT[CH->SLOT[3].Ecurp])(YM2612,CH->SLOT + 3);
      }
      YM2612->in0 = YM2612->in0 + (CH->S0_OUT[1] + CH->S0_OUT[0] >> ((byte)CH->FB & 0x1f));
      iVar2 = CH->S0_OUT[0];
      CH->S0_OUT[1] = iVar2;
      CH->S0_OUT[0] =
           *(int *)(*(long *)((long)SIN_TAB + (ulong)((uint)YM2612->in0 >> 0xb & 0x7ff8)) +
                   (long)YM2612->en0 * 4);
      uVar8 = iVar2 + YM2612->in1;
      YM2612->in1 = uVar8;
      uVar4 = YM2612->in2 + CH->S0_OUT[1];
      YM2612->in2 = uVar4;
      uVar5 = YM2612->in3 + CH->S0_OUT[1];
      YM2612->in3 = uVar5;
      uVar4 = *(int *)(*(long *)((long)SIN_TAB + (ulong)(uVar8 >> 0xb & 0x7ff8)) +
                      (long)YM2612->en1 * 4) +
              *(int *)(*(long *)((long)SIN_TAB + (ulong)(uVar5 >> 0xb & 0x7ff8)) +
                      (long)YM2612->en3 * 4) +
              *(int *)(*(long *)((long)SIN_TAB + (ulong)(uVar4 >> 0xb & 0x7ff8)) +
                      (long)YM2612->en2 * 4) >> 0xf;
      CH->OUTd = uVar4;
      uVar8 = 0x2fff;
      if ((0x2fff < (int)uVar4) || (uVar8 = 0xffffd001, (int)uVar4 < -0x2fff)) {
        uVar4 = uVar8;
        CH->OUTd = uVar4;
      }
      (*buf)[uVar6] = (*buf)[uVar6] + (uVar4 & CH->LEFT);
      buf[1][uVar6] = buf[1][uVar6] + (CH->RIGHT & CH->OUTd);
    }
  }
  return;
}

Assistant:

static void Update_Chan_Algo5_LFO(ym2612_ *YM2612, channel_ *CH, DEV_SMPL **buf, UINT32 length)
{
  UINT32 i;
  int env_LFO, freq_LFO;

  if ((CH->SLOT[S1].Ecnt == ENV_END) && (CH->SLOT[S2].Ecnt == ENV_END) && (CH->SLOT[S3].Ecnt == ENV_END))
    return;

#if YM_DEBUG_LEVEL > 1
  fprintf(debug_file, "\n\nAlgo 5 LFO len = %d\n\n", length);
#endif

  for (i = 0; i < length; i++)
  {
    GET_CURRENT_PHASE
    UPDATE_PHASE_LFO
    GET_CURRENT_ENV_LFO
    UPDATE_ENV
    DO_ALGO_5
    DO_OUTPUT
  }
}